

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mullwo(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_3;
  TCGv_i32 ret;
  uintptr_t o_2;
  TCGv_i32 ret_00;
  
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)pTVar1 - (long)s);
  tcg_gen_extrl_i64_i32_ppc64(s,ret_00,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
  tcg_gen_extrl_i64_i32_ppc64(s,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)))
  ;
  tcg_gen_muls2_i32_ppc64(s,ret_00,ret,ret_00,ret);
  tcg_gen_concat_i32_i64_ppc64
            (s,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),ret_00,ret);
  tcg_gen_sari_i32_ppc64(s,ret_00,ret_00,0x1f);
  tcg_gen_setcond_i32_ppc64(s,TCG_COND_NE,ret_00,ret_00,ret);
  tcg_gen_extu_i32_i64_ppc64(s,cpu_ov,ret_00);
  if ((ctx->insns_flags2 & 0x80000) != 0) {
    if (cpu_ov32 != cpu_ov) {
      tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)(cpu_ov32 + (long)s),(TCGArg)(cpu_ov + (long)s));
    }
  }
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)(cpu_so + (long)s),(TCGArg)(cpu_so + (long)s),
                    (TCGArg)(cpu_ov + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  if ((ctx->opcode & 1) != 0) {
    gen_mullwo_cold_1();
  }
  return;
}

Assistant:

static void gen_mullwo(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_trunc_tl_i32(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_muls2_i32(tcg_ctx, t0, t1, t0, t1);
#if defined(TARGET_PPC64)
    tcg_gen_concat_i32_i64(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0, t1);
#else
    tcg_gen_mov_i32(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0);
#endif

    tcg_gen_sari_i32(tcg_ctx, t0, t0, 31);
    tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, t0, t0, t1);
    tcg_gen_extu_i32_tl(tcg_ctx, cpu_ov, t0);
    if (is_isa300(ctx)) {
        tcg_gen_mov_tl(tcg_ctx, cpu_ov32, cpu_ov);
    }
    tcg_gen_or_tl(tcg_ctx, cpu_so, cpu_so, cpu_ov);

    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}